

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall
kratos::SystemVerilogCodeGen::generate_parameters(SystemVerilogCodeGen *this,Generator *generator)

{
  undefined1 *puVar1;
  ParamType PVar2;
  Param *this_00;
  int64_t value;
  char cVar3;
  undefined8 uVar4;
  uint32_t width;
  ostream *poVar5;
  _Base_ptr p_Var6;
  ulong uVar7;
  undefined1 *puVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar9;
  string_view sVar10;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  undefined1 auStack_378 [8];
  Const c;
  string local_d0;
  undefined1 auStack_b0 [8];
  string param_str;
  _Alloc_hider local_80;
  string type_str;
  string value_str;
  
  if ((generator->params_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    puVar8 = &(this->stream_).super_stringstream.field_0x10;
    poVar5 = std::operator<<((ostream *)puVar8,"#(");
    puVar1 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar1 = *(long *)puVar1 + 1;
    std::operator<<(poVar5,'\n');
    this->indent_ = this->indent_ + 1;
    p_Var6 = (generator->params_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    param_str.field_2._8_8_ = &(generator->params_)._M_t._M_impl.super__Rb_tree_header;
    uVar7 = 1;
    value_str.field_2._8_8_ = this;
    while (p_Var6 != (_Base_ptr)param_str.field_2._8_8_) {
      type_str.field_2._8_8_ = &value_str._M_string_length;
      value_str._M_dataplus._M_p = (pointer)0x0;
      value_str._M_string_length._0_1_ = 0;
      local_80._M_p = (pointer)&type_str._M_string_length;
      type_str._M_dataplus._M_p = (pointer)0x0;
      type_str._M_string_length._0_1_ = 0;
      this_00 = *(Param **)(p_Var6 + 2);
      if (((this_00->initial_value_).super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_engaged & 1U) == 0) {
        PVar2 = this_00->param_type_;
        if (PVar2 != Parameter) {
          if (PVar2 == Enum) {
            std::__cxx11::string::_M_assign((string *)&local_80);
          }
          else if (PVar2 == RawType) {
            std::__cxx11::string::assign((char *)&local_80);
            std::
            _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              *)auStack_378,
                             (_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              *)(*(long *)(p_Var6 + 2) + 0x388));
            cVar3 = (char)c.super_Var.super_IRNode.fn_name_ln.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::
            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)auStack_378);
            if (cVar3 == '\x01') {
              std::
              _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                *)auStack_378,
                               (_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                *)(*(long *)(p_Var6 + 2) + 0x388));
              std::__cxx11::string::operator=
                        ((string *)(type_str.field_2._M_local_buf + 8),(string *)auStack_378);
              std::
              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)auStack_378);
            }
            std::
            _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              *)auStack_378,
                             (_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              *)(*(long *)(p_Var6 + 2) + 0x3b0));
            cVar3 = (char)c.super_Var.super_IRNode.fn_name_ln.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::
            _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)auStack_378);
            if (cVar3 == '\x01') {
              std::
              _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                *)auStack_378,
                               (_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                *)(*(long *)(p_Var6 + 2) + 0x3b0));
              std::__cxx11::string::operator=
                        ((string *)(type_str.field_2._M_local_buf + 8),(string *)auStack_378);
              std::
              _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)auStack_378);
            }
          }
          else if (this_00->has_value_ == true) {
            Param::value_str_abi_cxx11_((string *)auStack_378,this_00);
            std::__cxx11::string::operator=
                      ((string *)(type_str.field_2._M_local_buf + 8),(string *)auStack_378);
            std::__cxx11::string::~string((string *)auStack_378);
          }
        }
      }
      else {
        value = (this_00->initial_value_).super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_payload._M_value;
        width = (*(this_00->super_Const).super_Var.super_IRNode._vptr_IRNode[7])(this_00);
        Const::Const((Const *)auStack_378,value,width,*(bool *)(*(long *)(p_Var6 + 2) + 0xf0));
        Const::to_string_abi_cxx11_((string *)auStack_b0,(Const *)auStack_378);
        std::__cxx11::string::operator=
                  ((string *)(type_str.field_2._M_local_buf + 8),(string *)auStack_b0);
        std::__cxx11::string::~string((string *)auStack_b0);
        Const::~Const((Const *)auStack_378);
      }
      if (type_str._M_dataplus._M_p == (pointer)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)auStack_b0,"parameter",(allocator<char> *)auStack_378);
      }
      else {
        auStack_378 = (undefined1  [8])local_80._M_p;
        c.super_Var.super_IRNode._vptr_IRNode = (_func_int **)type_str._M_dataplus._M_p;
        bVar9 = fmt::v7::to_string_view<char,_0>("parameter {0}");
        format_str.data_ = (char *)bVar9.size_;
        format_str.size_ = 0xd;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)auStack_378;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)auStack_b0,(detail *)bVar9.data_,format_str,args);
      }
      sVar10 = indent((SystemVerilogCodeGen *)value_str.field_2._8_8_);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar8,sVar10._M_str,sVar10._M_len);
      if (value_str._M_dataplus._M_p == (pointer)0x0) {
        c.super_Var.super_IRNode.fn_name_ln.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(p_Var6 + 1);
        c.super_Var.super_IRNode.fn_name_ln.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var6[1]._M_parent;
        auStack_378 = auStack_b0;
        c.super_Var.super_IRNode._vptr_IRNode = (_func_int **)param_str._M_dataplus._M_p;
        bVar9 = fmt::v7::to_string_view<char,_0>("{0} {1}");
        format_str_01.data_ = (char *)bVar9.size_;
        format_str_01.size_ = 0xdd;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)auStack_378;
        fmt::v7::detail::vformat_abi_cxx11_(&local_d0,(detail *)bVar9.data_,format_str_01,args_01);
      }
      else {
        c.super_Var.super_IRNode.fn_name_ln.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(p_Var6 + 1);
        c.super_Var.super_IRNode.fn_name_ln.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var6[1]._M_parent;
        auStack_378 = auStack_b0;
        c.super_Var.super_IRNode._vptr_IRNode = (_func_int **)param_str._M_dataplus._M_p;
        c.super_Var.super_IRNode.fn_name_ln.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)type_str.field_2._8_8_;
        c.super_Var.super_IRNode._32_8_ = value_str._M_dataplus._M_p;
        bVar9 = fmt::v7::to_string_view<char,_0>("{0} {1} = {2}");
        format_str_00.data_ = (char *)bVar9.size_;
        format_str_00.size_ = 0xddd;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)auStack_378;
        fmt::v7::detail::vformat_abi_cxx11_(&local_d0,(detail *)bVar9.data_,format_str_00,args_00);
      }
      std::operator<<(poVar5,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      if (uVar7 < (generator->params_)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        std::operator<<((ostream *)puVar8,",");
      }
      *(long *)(value_str.field_2._8_8_ + 0x178) = *(long *)(value_str.field_2._8_8_ + 0x178) + 1;
      std::operator<<((ostream *)puVar8,'\n');
      std::__cxx11::string::~string((string *)auStack_b0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)(type_str.field_2._M_local_buf + 8));
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      uVar7 = (ulong)((int)uVar7 + 1);
    }
    poVar5 = std::operator<<((ostream *)puVar8,")");
    uVar4 = value_str.field_2._8_8_;
    *(long *)(value_str.field_2._8_8_ + 0x178) = *(long *)(value_str.field_2._8_8_ + 0x178) + 1;
    std::operator<<(poVar5,'\n');
    *(long *)(uVar4 + 0x10) = *(long *)(uVar4 + 0x10) + -1;
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::generate_parameters(Generator* generator) {
    const auto& params = generator->get_params();
    if (!params.empty()) {
        stream_ << "#(" << stream_.endl();
        indent_++;
        uint32_t count = 0;
        for (auto const& [name, param] : params) {
            std::string value_str, type_str;
            if (param->get_initial_value()) {
                auto value = *param->get_initial_value();
                auto c = Const(value, param->width(), param->is_signed());
                value_str = c.to_string();
            } else if (param->param_type() == ParamType::RawType) {
                type_str = "type";
                // determine the initial values
                if (param->get_raw_str_value()) {
                    value_str = *param->get_raw_str_value();
                }
                if (param->get_raw_str_initial_value()) {
                    // use the initial lvalue instead since it's user's intention
                    value_str = *param->get_raw_str_initial_value();
                }
            } else if (param->param_type() == ParamType::Enum) {
                type_str = param->enum_def()->name;
            } else if (param->param_type() != ParamType::Parameter) {
                if (param->has_value()) value_str = param->value_str();
            }
            std::string param_str =
                type_str.empty() ? "parameter" : ::format("parameter {0}", type_str);
            stream_ << indent()
                    << (value_str.empty() ? ::format("{0} {1}", param_str, name)
                                          : ::format("{0} {1} = {2}", param_str, name, value_str));
            if (++count < params.size()) {
                stream_ << ",";
            }
            stream_ << stream_.endl();
        }
        stream_ << ")" << stream_.endl();
        indent_--;
    }
}